

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O3

void __thiscall
Qentem::Array<unsigned_int>::Array(Array<unsigned_int> *this,Array<unsigned_int> *src)

{
  uint *puVar1;
  SizeT SVar2;
  uint uVar3;
  uint *puVar4;
  uint *puVar5;
  
  this->storage_ = (uint *)0x0;
  this->index_ = 0;
  SVar2 = src->index_;
  this->capacity_ = SVar2;
  if (SVar2 != 0) {
    this->index_ = SVar2;
    puVar4 = allocate(this);
    if ((ulong)src->index_ != 0) {
      puVar5 = src->storage_;
      puVar1 = puVar5 + src->index_;
      do {
        uVar3 = *puVar5;
        puVar5 = puVar5 + 1;
        *puVar4 = uVar3;
        puVar4 = puVar4 + 1;
      } while (puVar5 < puVar1);
    }
  }
  return;
}

Assistant:

Array(const Array &src) : capacity_{src.Size()} {
        if (src.IsNotEmpty()) {
            setSize(src.Size());
            copyArray(src);
        }
    }